

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O1

Resolver * __thiscall
PoolList<Server::Private::Resolver>::
append<String_const&,unsigned_short,Server::Private::EstablisherImpl&>
          (PoolList<Server::Private::Resolver> *this,String *a,unsigned_short b,EstablisherImpl *c)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  Resolver *this_00;
  PoolList<Server::Private::Resolver> *pPVar4;
  
  this_00 = allocateFreeItem(this);
  Server::Private::Resolver::Resolver(this_00,a,b,c);
  pIVar1 = (this->_end).item;
  pIVar2 = this->freeItem;
  this->freeItem = pIVar2->prev;
  pIVar3 = pIVar1->prev;
  pIVar2->prev = pIVar3;
  pPVar4 = this;
  if (pIVar3 != (Item *)0x0) {
    pPVar4 = (PoolList<Server::Private::Resolver> *)pIVar1->prev;
  }
  (pPVar4->_begin).item = pIVar2;
  pIVar2->next = pIVar1;
  pIVar1->prev = pIVar2;
  this->_size = this->_size + 1;
  return this_00;
}

Assistant:

T& append(A a, B b, C c) {return linkFreeItem(new (allocateFreeItem()) T(a, b, c));}